

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int isoent_cmp_iso9660_identifier(isoent *p1,isoent *p2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *__s1;
  char *__s2;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  size_t __n;
  ulong __n_00;
  
  __s1 = p1->identifier;
  __s2 = p2->identifier;
  iVar1 = p1->ext_off;
  iVar2 = p2->ext_off;
  iVar6 = iVar2;
  if (iVar1 < iVar2) {
    iVar6 = iVar1;
  }
  __n = (size_t)iVar6;
  iVar6 = memcmp(__s1,__s2,__n);
  if (iVar6 != 0) {
    return iVar6;
  }
  if (iVar1 < iVar2) {
    lVar7 = 0;
    do {
      if (iVar2 - iVar1 == (int)lVar7) goto LAB_0016e971;
      lVar5 = lVar7 + __n;
      uVar8 = (uint)(byte)__s2[lVar5];
      lVar7 = lVar7 + 1;
    } while (__s2[lVar5] == 0x20);
LAB_0016e943:
    return 0x20 - uVar8;
  }
  if (iVar2 < iVar1) {
    lVar7 = 0;
    while (iVar1 - iVar2 != (int)lVar7) {
      lVar5 = lVar7 + __n;
      lVar7 = lVar7 + 1;
      if ((byte)__s1[lVar5] != 0x20) {
        return (byte)__s1[lVar5] - 0x20;
      }
    }
  }
LAB_0016e971:
  uVar3 = p1->ext_len;
  if (uVar3 == 1) {
    if (p2->ext_len != 1) {
      return -1;
    }
  }
  else if (uVar3 == 0) {
    if (p2->ext_len != 0) {
      return -1;
    }
  }
  else {
    if ((int)uVar3 < 2) {
      return -1;
    }
    uVar4 = p2->ext_len;
    if ((int)uVar4 < 2) {
      return 1;
    }
    uVar8 = uVar4;
    if (uVar3 < uVar4) {
      uVar8 = uVar3;
    }
    __n_00 = (ulong)uVar8;
    iVar6 = memcmp(__s1 + iVar1,__s2 + iVar2,__n_00);
    if (iVar6 != 0) {
      return iVar6;
    }
    if (uVar3 < uVar4) {
      lVar7 = 0;
      do {
        if (uVar4 - uVar3 == (int)lVar7) {
          return 0;
        }
        lVar5 = lVar7 + __n_00;
        lVar7 = lVar7 + 1;
        uVar8 = (uint)(byte)(__s2 + iVar2)[lVar5];
      } while (uVar8 == 0x20);
      goto LAB_0016e943;
    }
    if (uVar4 < uVar3) {
      lVar7 = 0;
      do {
        if (uVar3 - uVar4 == (int)lVar7) {
          return 0;
        }
        lVar5 = lVar7 + __n_00;
        lVar7 = lVar7 + 1;
        uVar8 = (uint)(byte)(__s1 + iVar1)[lVar5];
      } while (uVar8 == 0x20);
      return uVar8 - 0x20;
    }
  }
  return 0;
}

Assistant:

static int
isoent_cmp_iso9660_identifier(const struct isoent *p1, const struct isoent *p2)
{
	const char *s1, *s2;
	int cmp;
	int l;

	s1 = p1->identifier;
	s2 = p2->identifier;

	/* Compare File Name */
	l = p1->ext_off;
	if (l > p2->ext_off)
		l = p2->ext_off;
	cmp = memcmp(s1, s2, l);
	if (cmp != 0)
		return (cmp);
	if (p1->ext_off < p2->ext_off) {
		s2 += l;
		l = p2->ext_off - p1->ext_off;
		while (l--)
			if (0x20 != *s2++)
				return (0x20
				    - *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_off > p2->ext_off) {
		s1 += l;
		l = p1->ext_off - p2->ext_off;
		while (l--)
			if (0x20 != *s1++)
				return (*(const unsigned char *)(s1 - 1)
				    - 0x20);
	}
	/* Compare File Name Extension */
	if (p1->ext_len == 0 && p2->ext_len == 0)
		return (0);
	if (p1->ext_len == 1 && p2->ext_len == 1)
		return (0);
	if (p1->ext_len <= 1)
		return (-1);
	if (p2->ext_len <= 1)
		return (1);
	l = p1->ext_len;
	if (l > p2->ext_len)
		l = p2->ext_len;
	s1 = p1->identifier + p1->ext_off;
	s2 = p2->identifier + p2->ext_off;
	if (l > 1) {
		cmp = memcmp(s1, s2, l);
		if (cmp != 0)
			return (cmp);
	}
	if (p1->ext_len < p2->ext_len) {
		s2 += l;
		l = p2->ext_len - p1->ext_len;
		while (l--)
			if (0x20 != *s2++)
				return (0x20
				    - *(const unsigned char *)(s2 - 1));
	} else if (p1->ext_len > p2->ext_len) {
		s1 += l;
		l = p1->ext_len - p2->ext_len;
		while (l--)
			if (0x20 != *s1++)
				return (*(const unsigned char *)(s1 - 1)
				    - 0x20);
	}
	/* Compare File Version Number */
	/* No operation. The File Version Number is always one. */

	return (cmp);
}